

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O0

void __thiscall
Assimp::X3DImporter::MeshGeometry_AddTexCoord
          (X3DImporter *this,aiMesh *pMesh,
          list<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *pTexCoords)

{
  float fVar1;
  bool bVar2;
  size_type sVar3;
  DeadlyImportError *this_00;
  reference paVar4;
  ulong uVar5;
  aiVector3D *paVar6;
  reference pvVar7;
  aiVector3t<float> *local_d0;
  ulong local_98;
  size_t i;
  _Self local_80;
  _Self local_78;
  const_iterator it;
  allocator<char> local_59;
  string local_58;
  undefined1 local_38 [8];
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> tc_arr_copy;
  list<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *pTexCoords_local;
  aiMesh *pMesh_local;
  X3DImporter *this_local;
  
  tc_arr_copy.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)pTexCoords;
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::vector
            ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_38);
  sVar3 = std::__cxx11::list<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::size
                    ((list<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)
                     tc_arr_copy.
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
  if (sVar3 != pMesh->mNumVertices) {
    it._M_node._3_1_ = 1;
    this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,
               "MeshGeometry_AddTexCoord. Texture coordinates and vertices count must be equal.",
               &local_59);
    DeadlyImportError::DeadlyImportError(this_00,&local_58);
    it._M_node._3_1_ = 0;
    __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  sVar3 = std::__cxx11::list<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::size
                    ((list<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)
                     tc_arr_copy.
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
            ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_38,sVar3);
  local_78._M_node =
       (_List_node_base *)
       std::__cxx11::list<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::begin
                 ((list<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)
                  tc_arr_copy.
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage);
  while( true ) {
    local_80._M_node =
         (_List_node_base *)
         std::__cxx11::list<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::end
                   ((list<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)
                    tc_arr_copy.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
    bVar2 = std::operator!=(&local_78,&local_80);
    if (!bVar2) break;
    paVar4 = std::_List_const_iterator<aiVector2t<float>_>::operator*(&local_78);
    fVar1 = paVar4->x;
    paVar4 = std::_List_const_iterator<aiVector2t<float>_>::operator*(&local_78);
    aiVector3t<float>::aiVector3t((aiVector3t<float> *)((long)&i + 4),fVar1,paVar4->y,0.0);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_38,
               (value_type *)((long)&i + 4));
    std::_List_const_iterator<aiVector2t<float>_>::operator++(&local_78);
  }
  uVar5 = (ulong)pMesh->mNumVertices;
  paVar6 = (aiVector3D *)operator_new__(uVar5 * 0xc);
  if (uVar5 != 0) {
    local_d0 = paVar6;
    do {
      aiVector3t<float>::aiVector3t(local_d0);
      local_d0 = local_d0 + 1;
    } while (local_d0 != paVar6 + uVar5);
  }
  pMesh->mTextureCoords[0] = paVar6;
  pMesh->mNumUVComponents[0] = 2;
  for (local_98 = 0; local_98 < pMesh->mNumVertices; local_98 = local_98 + 1) {
    pvVar7 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                       ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_38,
                        local_98);
    paVar6 = pMesh->mTextureCoords[0] + local_98;
    fVar1 = pvVar7->y;
    paVar6->x = pvVar7->x;
    paVar6->y = fVar1;
    paVar6->z = pvVar7->z;
  }
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~vector
            ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_38);
  return;
}

Assistant:

void X3DImporter::MeshGeometry_AddTexCoord(aiMesh& pMesh, const std::list<aiVector2D>& pTexCoords) const
{
    std::vector<aiVector3D> tc_arr_copy;

    if ( pTexCoords.size() != pMesh.mNumVertices )
    {
        throw DeadlyImportError( "MeshGeometry_AddTexCoord. Texture coordinates and vertices count must be equal." );
    }

	// copy list to array because we are need convert aiVector2D to aiVector3D and also get indexed access as a bonus.
	tc_arr_copy.reserve(pTexCoords.size());
    for ( std::list<aiVector2D>::const_iterator it = pTexCoords.begin(); it != pTexCoords.end(); ++it )
    {
        tc_arr_copy.push_back( aiVector3D( ( *it ).x, ( *it ).y, 0 ) );
    }

	// copy texture coordinates to mesh
	pMesh.mTextureCoords[0] = new aiVector3D[pMesh.mNumVertices];
	pMesh.mNumUVComponents[0] = 2;
    for ( size_t i = 0; i < pMesh.mNumVertices; i++ )
    {
        pMesh.mTextureCoords[ 0 ][ i ] = tc_arr_copy[ i ];
    }
}